

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O3

bool __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::evaluate
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          QExpression *left,QExpression **expr,QOperation previous_oper)

{
  QExpression *expr_00;
  bool bVar1;
  QOperation operation;
  QExpression *next_expr;
  QExpression right;
  QExpression *local_50;
  anon_union_16_3_21f97482_for_QExpression_0 local_48;
  undefined2 local_38;
  
  local_38 = 0;
  local_48.SubExpressions.storage_ = (QExpression *)0x0;
  local_48._8_8_ = 0;
  bVar1 = GetExpressionValue(this,left,*expr,(*expr)->Operation);
  if (bVar1) {
    operation = (*expr)->Operation;
    if (operation != NoOp) {
      local_50 = *expr;
      do {
        expr_00 = local_50 + 1;
        if (operation < local_50[1].Operation) {
          local_50 = expr_00;
          bVar1 = evaluate(this,(QExpression *)&local_48.SubExpressions,&local_50,operation);
          if (!bVar1) goto LAB_00128250;
          bVar1 = evaluateExpression(this,left,(QExpression *)&local_48.SubExpressions,
                                     (*expr)->Operation);
          if (!bVar1) goto LAB_00128250;
          *expr = local_50;
          operation = local_50->Operation;
        }
        else {
          local_50 = expr_00;
          bVar1 = GetExpressionValue(this,(QExpression *)&local_48.SubExpressions,expr_00,operation)
          ;
          if (!bVar1) goto LAB_00128250;
          bVar1 = evaluateExpression(this,left,(QExpression *)&local_48.SubExpressions,
                                     (*expr)->Operation);
          if (!bVar1) goto LAB_00128250;
          *expr = local_50;
          operation = local_50->Operation;
          if (operation <= previous_oper) {
            bVar1 = true;
            goto LAB_00128252;
          }
        }
      } while (operation != NoOp);
    }
    bVar1 = left->Type != NotANumber;
  }
  else {
LAB_00128250:
    bVar1 = false;
  }
LAB_00128252:
  if (local_38._1_1_ == '\x06') {
    Array<Qentem::QExpression>::~Array(&local_48.SubExpressions);
  }
  return bVar1;
}

Assistant:

bool evaluate(QExpression &left, const QExpression *&expr, const QOperation previous_oper) const noexcept {
        const QExpression *next_expr;
        QExpression        right;

        if (GetExpressionValue(left, expr, expr->Operation)) {
            while (expr->Operation != QOperation::NoOp) {
                next_expr = (expr + 1U);

                if (expr->Operation >= next_expr->Operation) {
                    if (GetExpressionValue(right, next_expr, expr->Operation) &&
                        evaluateExpression(left, right, expr->Operation)) {
                        expr = next_expr;

                        if (previous_oper < expr->Operation) {
                            continue;
                        }

                        return true;
                    }
                } else if (evaluate(right, next_expr, expr->Operation) &&
                           evaluateExpression(left, right, expr->Operation)) {
                    expr = next_expr;
                    continue;
                }

                return false;
            }

            return (left.Type != ExpressionType::NotANumber);
        }

        return false;
    }